

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_post.c
# Opt level: O0

void test_post_on_response(nhr_request request,nhr_response response)

{
  short sVar1;
  uint body_len_00;
  char *body_00;
  unsigned_long test_number_00;
  unsigned_long test_number;
  uint body_len;
  char *body;
  nhr_response response_local;
  nhr_request request_local;
  
  body_00 = (char *)nhr_response_get_body(response);
  body_len_00 = nhr_response_get_body_length(response);
  test_number_00 = nhr_request_get_user_object(request);
  test_post_error = 1;
  printf("\nResponse #%lu:\n",test_number_00);
  test_post_log_body(body_00,body_len_00);
  if (test_number_00 == 0) {
    test_post_error = 10;
  }
  else {
    sVar1 = nhr_response_get_status_code(response);
    if (sVar1 == 200) {
      if ((body_00 == (char *)0x0) || (body_len_00 == 0)) {
        test_post_error = 5;
      }
      else {
        test_post_error = test_post_parse_body(body_00,test_number_00);
      }
    }
    else {
      test_post_error = 0xf;
    }
  }
  test_post_working = '\0';
  return;
}

Assistant:

static void test_post_on_response(nhr_request request, nhr_response response) {
	char * body = nhr_response_get_body(response);
	unsigned int body_len = nhr_response_get_body_length(response);
	unsigned long test_number = (unsigned long)nhr_request_get_user_object(request);
	test_post_error = 1;

	printf("\nResponse #%lu:\n", test_number);
	test_post_log_body(body, body_len);
	if (test_number == 0) {
		test_post_error = 10;
		test_post_working = nhr_false;
		return;
	}

	if (nhr_response_get_status_code(response) != 200) {
		test_post_error = 15;
		test_post_working = nhr_false;
		return;
	}

	if (body && body_len) {
		test_post_error = test_post_parse_body(body, test_number);
	} else {
		test_post_error = 5;
	}

	test_post_working = nhr_false;
}